

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
* __thiscall
gl3cts::ReservedNamesTest::getSupportedShaderTypes
          (vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
           *__return_storage_ptr__,ReservedNamesTest *this)

{
  iterator iVar1;
  bool bVar2;
  ContextType ctxType;
  anon_enum_32 local_1c;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar2) {
    local_1c = LANGUAGE_FEATURE_ATOMIC_COUNTER;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = LANGUAGE_FEATURE_ATOMIC_COUNTER;
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_1c = LANGUAGE_FEATURE_ATTRIBUTE;
  iVar1._M_current =
       (__return_storage_ptr__->
       super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
              (__return_storage_ptr__,iVar1,&local_1c);
  }
  else {
    *iVar1._M_current = LANGUAGE_FEATURE_ATTRIBUTE;
    (__return_storage_ptr__->
    super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x123);
  if (bVar2) {
    local_1c = LANGUAGE_FEATURE_CONSTANT;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = LANGUAGE_FEATURE_CONSTANT;
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar2) {
    local_1c = LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME;
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = LANGUAGE_FEATURE_FUNCTION_NAME;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = LANGUAGE_FEATURE_FUNCTION_NAME;
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_1c = LANGUAGE_FEATURE_INPUT;
  iVar1._M_current =
       (__return_storage_ptr__->
       super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
              (__return_storage_ptr__,iVar1,&local_1c);
  }
  else {
    *iVar1._M_current = LANGUAGE_FEATURE_INPUT;
    (__return_storage_ptr__->
    super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReservedNamesTest::_shader_type> ReservedNamesTest::getSupportedShaderTypes() const
{
	const glu::ContextType	context_type = m_context.getRenderContext().getType();
	std::vector<_shader_type> result;

	/* CS: Available, starting with GL 4.3 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		result.push_back(SHADER_TYPE_COMPUTE);
	}

	/* FS: Always supported */
	result.push_back(SHADER_TYPE_FRAGMENT);

	/* GS: Available, starting with GL 3.2 */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		result.push_back(SHADER_TYPE_GEOMETRY);
	}

	/* TC: Available, starting with GL 4.0 */
	/* TE: Available, starting with GL 4.0 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		result.push_back(SHADER_TYPE_TESS_CONTROL);
		result.push_back(SHADER_TYPE_TESS_EVALUATION);
	}

	/* VS: Always supported */
	result.push_back(SHADER_TYPE_VERTEX);

	return result;
}